

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::GuessLibrarySOName(string *fullPath,string *soname)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  string name;
  cmELF elf;
  string local_88;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  cmELF local_48;
  
  cmELF::cmELF(&local_48,(fullPath->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid(&local_48);
  if (bVar2) {
    bVar2 = cmELF::GetSOName(&local_48,soname);
  }
  else {
    bVar2 = cmsys::SystemTools::FileIsSymlink(fullPath);
    if (bVar2) {
      bVar2 = cmsys::SystemTools::ReadSymlink(fullPath,soname);
      if (bVar2) {
        cmsys::SystemTools::GetFilenamePath(&local_88,soname);
        sVar1 = local_88._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (sVar1 == 0) {
          cmsys::SystemTools::GetFilenameName(&local_88,fullPath);
          if (local_88._M_string_length < soname->_M_string_length) {
            std::__cxx11::string::substr((ulong)&local_68,(ulong)soname);
            if (local_60 == local_88._M_string_length) {
              if (local_60 == 0) {
                bVar2 = true;
              }
              else {
                iVar3 = bcmp(local_68,local_88._M_dataplus._M_p,local_60);
                bVar2 = iVar3 == 0;
              }
            }
            else {
              bVar2 = false;
            }
            if (local_68 != local_58) {
              operator_delete(local_68,local_58[0] + 1);
            }
          }
          else {
            bVar2 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0035f26a;
        }
      }
    }
    bVar2 = false;
  }
LAB_0035f26a:
  cmELF::~cmELF(&local_48);
  return bVar2;
}

Assistant:

bool cmSystemTools::GuessLibrarySOName(std::string const& fullPath,
                                       std::string& soname)
{
  // For ELF shared libraries use a real parser to get the correct
  // soname.
#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fullPath.c_str());
  if(elf)
    {
    return elf.GetSOName(soname);
    }
#endif

  // If the file is not a symlink we have no guess for its soname.
  if(!cmSystemTools::FileIsSymlink(fullPath))
    {
    return false;
    }
  if(!cmSystemTools::ReadSymlink(fullPath, soname))
    {
    return false;
    }

  // If the symlink has a path component we have no guess for the soname.
  if(!cmSystemTools::GetFilenamePath(soname).empty())
    {
    return false;
    }

  // If the symlink points at an extended version of the same name
  // assume it is the soname.
  std::string name = cmSystemTools::GetFilenameName(fullPath);
  if(soname.length() > name.length() &&
     soname.substr(0, name.length()) == name)
    {
    return true;
    }
  return false;
}